

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_memq_op(sexp ctx,sexp self,sexp_sint_t n,sexp x,sexp ls)

{
  sexp psVar1;
  
  for (; ((psVar1 = (sexp)&DAT_0000003e, ((ulong)ls & 3) == 0 && (ls->tag == 6)) &&
         (psVar1 = ls, (ls->value).type.name != x)); ls = (ls->value).type.cpl) {
  }
  return psVar1;
}

Assistant:

sexp sexp_memq_op (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp ls) {
  while (sexp_pairp(ls))
    if (x == sexp_car(ls))
      return ls;
    else
      ls = sexp_cdr(ls);
  return SEXP_FALSE;
}